

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidateStreamLocator(void *ctx,char **file,unsigned_long *line)

{
  int iVar1;
  
  iVar1 = -1;
  if ((ctx != (void *)0x0) && (file != (char **)0x0 || line != (unsigned_long *)0x0)) {
    if (file != (char **)0x0) {
      *file = (char *)0x0;
    }
    if (line != (unsigned_long *)0x0) {
      *line = 0;
    }
    if (*(long *)((long)ctx + 0x38) != 0) {
      if (file != (char **)0x0) {
        *file = *(char **)(*(long *)((long)ctx + 0x38) + 8);
      }
      iVar1 = 0;
      if (line != (unsigned_long *)0x0) {
        *line = (long)*(int *)(*(long *)((long)ctx + 0x38) + 0x34);
      }
    }
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaValidateStreamLocator(void *ctx, const char **file,
                               unsigned long *line) {
    xmlParserCtxtPtr ctxt;

    if ((ctx == NULL) || ((file == NULL) && (line == NULL)))
        return(-1);

    if (file != NULL)
        *file = NULL;
    if (line != NULL)
        *line = 0;

    ctxt = (xmlParserCtxtPtr) ctx;
    if (ctxt->input != NULL) {
       if (file != NULL)
           *file = ctxt->input->filename;
       if (line != NULL)
           *line = ctxt->input->line;
       return(0);
    }
    return(-1);
}